

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

size_t __thiscall
spvtools::opt::analysis::Struct::ComputeExtraStateHash(Struct *this,size_t hash,SeenTypes *seen)

{
  pointer ppTVar1;
  _Base_ptr p_Var2;
  pointer ppTVar3;
  
  ppTVar1 = (this->element_types_).
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar3 = (this->element_types_).
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar1;
      ppTVar3 = ppTVar3 + 1) {
    hash = Type::ComputeHashValue(*ppTVar3,hash,seen);
  }
  for (p_Var2 = (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->element_decorations_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    hash = utils::
           hash_combine<unsigned_int,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                     (hash,&p_Var2[1]._M_color,
                      (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)&p_Var2[1]._M_parent);
  }
  return hash;
}

Assistant:

size_t Struct::ComputeExtraStateHash(size_t hash, SeenTypes* seen) const {
  for (auto* t : element_types_) {
    hash = t->ComputeHashValue(hash, seen);
  }
  for (const auto& pair : element_decorations_) {
    hash = hash_combine(hash, pair.first, pair.second);
  }
  return hash;
}